

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vorbisfile.c
# Opt level: O2

int ov_time_seek(OggVorbis_File *vf,double seconds)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double local_40;
  
  iVar2 = -0x83;
  if (1 < vf->ready_state) {
    if (vf->seekable == 0) {
      iVar2 = -0x8a;
    }
    else if (0.0 <= seconds) {
      local_40 = 0.0;
      uVar1 = vf->links;
      uVar5 = 0;
      uVar6 = 0;
      if (0 < (int)uVar1) {
        uVar6 = (ulong)uVar1;
      }
      lVar3 = 8;
      lVar4 = 0;
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        dVar7 = ov_time_total(vf,(int)uVar5);
        if (seconds < dVar7 + local_40) {
          uVar6 = uVar5 & 0xffffffff;
          break;
        }
        lVar4 = lVar4 + *(long *)((long)vf->pcmlengths + lVar3);
        lVar3 = lVar3 + 0x10;
        local_40 = dVar7 + local_40;
      }
      if ((uint)uVar6 != uVar1) {
        iVar2 = ov_pcm_seek(vf,(long)((double)vf->vi[uVar6].rate * (seconds - local_40) +
                                     (double)lVar4));
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

int ov_time_seek(OggVorbis_File *vf,double seconds){
  /* translate time to PCM position and call ov_pcm_seek */

  int link=-1;
  ogg_int64_t pcm_total=0;
  double time_total=0.;

  if(vf->ready_state<OPENED)return(OV_EINVAL);
  if(!vf->seekable)return(OV_ENOSEEK);
  if(seconds<0)return(OV_EINVAL);

  /* which bitstream section does this time offset occur in? */
  for(link=0;link<vf->links;link++){
    double addsec = ov_time_total(vf,link);
    if(seconds<time_total+addsec)break;
    time_total+=addsec;
    pcm_total+=vf->pcmlengths[link*2+1];
  }

  if(link==vf->links)return(OV_EINVAL);

  /* enough information to convert time offset to pcm offset */
  {
    ogg_int64_t target=pcm_total+(seconds-time_total)*vf->vi[link].rate;
    return(ov_pcm_seek(vf,target));
  }
}